

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O2

void write_to_register(ymz280b_state *chip,UINT8 data)

{
  byte bVar1;
  UINT8 UVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  char *format;
  YMZ280BVoice *voice;
  
  bVar1 = chip->current_register;
  uVar5 = (uint)bVar1;
  if (-1 < (char)bVar1) {
    uVar3 = bVar1 >> 2 & 7;
    voice = chip->voice + uVar3;
    uVar5 = uVar5 & 99;
    switch(uVar5) {
    case 0:
      chip->voice[uVar3].fnum = (ushort)data | chip->voice[uVar3].fnum & 0x100;
      goto LAB_00149829;
    case 1:
      *(byte *)((long)&chip->voice[uVar3].fnum + 1) = data & 1;
      chip->voice[uVar3].looping = data >> 4 & 1;
      if ((data & 0x60) == 0) {
        data = data & 0x1f;
      }
      else {
        chip->voice[uVar3].mode = (data & 0x60) >> 5;
      }
      UVar2 = chip->voice[uVar3].keyon;
      if (((char)data < '\0') && (UVar2 == '\0')) {
        if (chip->keyon_enable != '\0') {
          voice->playing = '\x01';
          chip->voice[uVar3].position = chip->voice[uVar3].start;
          chip->voice[uVar3].signal = 0;
          chip->voice[uVar3].step = 0x7f;
          chip->voice[uVar3].loop_signal = 0;
          chip->voice[uVar3].loop_step = 0x7f;
          chip->voice[uVar3].loop_count = 0;
LAB_0014981f:
          chip->voice[uVar3].irq_schedule = '\0';
        }
      }
      else if ((-1 < (char)data) && (UVar2 != '\0')) {
        voice->playing = '\0';
        goto LAB_0014981f;
      }
      chip->voice[uVar3].keyon = data >> 7;
LAB_00149829:
      update_step(chip,voice);
      return;
    case 2:
      chip->voice[uVar3].level = data;
      break;
    case 3:
      chip->voice[uVar3].pan = data & 0xf;
      break;
    default:
      switch(uVar5) {
      case 0x20:
        uVar5 = chip->voice[uVar3].start & 0x1fffe;
        uVar6 = (uint)data << 0x11;
        break;
      case 0x21:
        uVar5 = chip->voice[uVar3].loop_start & 0x1fffe;
        uVar6 = (uint)data << 0x11;
LAB_001496f6:
        chip->voice[uVar3].loop_start = uVar6 | uVar5;
        return;
      case 0x22:
        uVar5 = chip->voice[uVar3].loop_end & 0x1fffe;
        uVar6 = (uint)data << 0x11;
LAB_0014965f:
        chip->voice[uVar3].loop_end = uVar6 | uVar5;
        return;
      case 0x23:
        uVar5 = chip->voice[uVar3].stop & 0x1fffe;
        uVar6 = (uint)data << 0x11;
LAB_001496c8:
        chip->voice[uVar3].stop = uVar6 | uVar5;
        return;
      default:
        switch(uVar5) {
        case 0x40:
          uVar5 = chip->voice[uVar3].start & 0x1fe01fe;
          uVar6 = (uint)data << 9;
          break;
        case 0x41:
          uVar5 = chip->voice[uVar3].loop_start & 0x1fe01fe;
          uVar6 = (uint)data << 9;
          goto LAB_001496f6;
        case 0x42:
          uVar5 = chip->voice[uVar3].loop_end & 0x1fe01fe;
          uVar6 = (uint)data << 9;
          goto LAB_0014965f;
        case 0x43:
          uVar5 = chip->voice[uVar3].stop & 0x1fe01fe;
          uVar6 = (uint)data << 9;
          goto LAB_001496c8;
        default:
          (*(code *)(&DAT_00168ca0 + *(int *)(&DAT_00168ca0 + (ulong)(uVar5 - 0x60) * 4)))();
          return;
        }
      }
      chip->voice[uVar3].start = uVar6 | uVar5;
      return;
    }
    update_volumes(voice);
    return;
  }
  switch(bVar1) {
  case 0x80:
  case 0x81:
  case 0x82:
    format = "DSP register write %02X = %02X\n";
    goto LAB_001495ec;
  case 0x84:
    chip->ext_mem_address_hi = (uint)data << 0x10;
    break;
  case 0x85:
    chip->ext_mem_address_mid = (uint)data << 8;
    break;
  case 0x86:
    uVar5 = (uint)data | chip->ext_mem_address_hi | chip->ext_mem_address_mid;
    chip->ext_mem_address = uVar5;
    if (chip->ext_mem_enable != '\0') {
      uVar5 = uVar5 & 0xffffff;
      if (uVar5 < chip->mem_size) {
        UVar2 = chip->mem_base[uVar5];
      }
      else {
        UVar2 = '\0';
      }
      chip->ext_readlatch = UVar2;
    }
    break;
  case 0x87:
    if (chip->ext_mem_enable != '\0') {
      if (chip->ext_write_handler != (_func_void_void_ptr_UINT32_UINT8 *)0x0) {
        (*chip->ext_write_handler)(chip->ext_param,chip->ext_mem_address,data);
      }
      chip->ext_mem_address = chip->ext_mem_address + 1 & 0xffffff;
    }
    break;
  default:
    if (uVar5 == 0xfe) {
      chip->irq_mask = data;
      update_irq_state(chip);
      return;
    }
    if (uVar5 == 0xff) {
      chip->ext_mem_enable = data >> 6 & 1;
      chip->irq_enable = data >> 4 & 1;
      update_irq_state(chip);
      if ((char)data < '\0' || chip->keyon_enable == '\0') {
        if (chip->keyon_enable == '\0' && (char)data < '\0') {
          for (lVar4 = 0x23; lVar4 != 0x283; lVar4 = lVar4 + 0x4c) {
            if ((*(char *)((long)chip->voice + lVar4 + -0x21) != '\0') &&
               (*(char *)((long)chip->voice + lVar4 + -0x20) != '\0')) {
              *(undefined1 *)((long)chip->voice + lVar4 + -0x23) = 1;
            }
          }
        }
      }
      else {
        for (lVar4 = 0x68; lVar4 != 0x2c8; lVar4 = lVar4 + 0x4c) {
          *(undefined1 *)((long)chip->voice + lVar4 + -0x68) = 0;
          *(undefined1 *)((long)chip->voice + lVar4 + -0x20) = 0;
        }
      }
      chip->keyon_enable = data >> 7;
      return;
    }
  case 0x83:
    format = "unknown register write %02X = %02X\n";
LAB_001495ec:
    emu_logf(&chip->logger,'\x04',format,(ulong)bVar1,data);
    return;
  }
  return;
}

Assistant:

static void write_to_register(ymz280b_state *chip, UINT8 data)
{
	struct YMZ280BVoice *voice;
	int i;

	/* lower registers follow a pattern */
	if (chip->current_register < 0x80)
	{
		voice = &chip->voice[(chip->current_register >> 2) & 7];

		switch (chip->current_register & 0xe3)
		{
			case 0x00:      /* pitch low 8 bits */
				voice->fnum = (voice->fnum & 0x100) | (data & 0xff);
				update_step(chip, voice);
				break;

			case 0x01:      /* pitch upper 1 bit, loop, key on, mode */
				voice->fnum = (voice->fnum & 0xff) | ((data & 0x01) << 8);
				voice->looping = (data & 0x10) >> 4;
				if ((data & 0x60) == 0) data &= 0x7f; /* ignore mode setting and set to same state as KON=0 */
				else voice->mode = (data & 0x60) >> 5;
				if (!voice->keyon && (data & 0x80) && chip->keyon_enable)
				{
					voice->playing = 1;
					voice->position = voice->start;
					voice->signal = voice->loop_signal = 0;
					voice->step = voice->loop_step = 0x7f;
					voice->loop_count = 0;

					/* if update_irq_state_timer is set, cancel it. */
					voice->irq_schedule = 0;
				}
				else if (voice->keyon && !(data & 0x80))
				{
					voice->playing = 0;

					// if update_irq_state_timer is set, cancel it.
					voice->irq_schedule = 0;
				}
				voice->keyon = (data & 0x80) >> 7;
				update_step(chip, voice);
				break;

			case 0x02:      /* total level */
				voice->level = data;
				update_volumes(voice);
				break;

			case 0x03:      /* pan */
				voice->pan = data & 0x0f;
				update_volumes(voice);
				break;

			case 0x20:      /* start address high */
				voice->start = (voice->start & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x21:      /* loop start address high */
				voice->loop_start = (voice->loop_start & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x22:      /* loop end address high */
				voice->loop_end = (voice->loop_end & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x23:      /* stop address high */
				voice->stop = (voice->stop & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x40:      /* start address middle */
				voice->start = (voice->start & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x41:      /* loop start address middle */
				voice->loop_start = (voice->loop_start & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x42:      /* loop end address middle */
				voice->loop_end = (voice->loop_end & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x43:      /* stop address middle */
				voice->stop = (voice->stop & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x60:      /* start address low */
				voice->start = (voice->start & (0xffff00 << 1)) | (data << 1);
				break;

			case 0x61:      /* loop start address low */
				voice->loop_start = (voice->loop_start & (0xffff00 << 1)) | (data << 1);
				break;

			case 0x62:      /* loop end address low */
				voice->loop_end = (voice->loop_end & (0xffff00 << 1)) | (data << 1);
				break;

			case 0x63:      /* stop address low */
				voice->stop = (voice->stop & (0xffff00 << 1)) | (data << 1);
				break;

			default:
				emu_logf(&chip->logger, DEVLOG_DEBUG, "unknown register write %02X = %02X\n", chip->current_register, data);
				break;
		}
	}

	/* upper registers are special */
	else
	{
		switch (chip->current_register)
		{
			/* DSP related (not implemented yet) */
			case 0x80: // d0-2: DSP Rch, d3: enable Rch (0: yes, 1: no), d4-6: DSP Lch, d7: enable Lch (0: yes, 1: no)
			case 0x81: // d0: enable control of $82 (0: yes, 1: no)
			case 0x82: // DSP data
				emu_logf(&chip->logger, DEVLOG_DEBUG, "DSP register write %02X = %02X\n", chip->current_register, data);
				break;

			case 0x84:      /* ROM readback / RAM write (high) */
				chip->ext_mem_address_hi = data << 16;
				break;

			case 0x85:      /* ROM readback / RAM write (middle) */
				chip->ext_mem_address_mid = data << 8;
				break;

			case 0x86:      /* ROM readback / RAM write (low) -> update latch */
				chip->ext_mem_address = chip->ext_mem_address_hi | chip->ext_mem_address_mid | data;
				if (chip->ext_mem_enable)
					chip->ext_readlatch = ymz280b_read_memory(chip, chip->ext_mem_address);
				break;

			case 0x87:      /* RAM write */
				if (chip->ext_mem_enable)
				{
					if (chip->ext_write_handler != NULL)
						chip->ext_write_handler(chip->ext_param, chip->ext_mem_address, data);
					//else
					//	emu_logf(&chip->logger, DEVLOG_TRACE, "attempted RAM write to %X\n", chip->ext_mem_address);
					chip->ext_mem_address = (chip->ext_mem_address + 1) & 0xffffff;
				}
				break;

			case 0xfe:      /* IRQ mask */
				chip->irq_mask = data;
				update_irq_state(chip);
				break;

			case 0xff:      /* IRQ enable, test, etc */
				chip->ext_mem_enable = (data & 0x40) >> 6;
				chip->irq_enable = (data & 0x10) >> 4;
				update_irq_state(chip);

				if (chip->keyon_enable && !(data & 0x80))
				{
					for (i = 0; i < 8; i++)
					{
						chip->voice[i].playing = 0;

						/* if update_irq_state_timer is set, cancel it. */
						chip->voice[i].irq_schedule = 0;
					}
				}
				else if (!chip->keyon_enable && (data & 0x80))
				{
					for (i = 0; i < 8; i++)
					{
						if (chip->voice[i].keyon && chip->voice[i].looping)
							chip->voice[i].playing = 1;
					}
				}
				chip->keyon_enable = (data & 0x80) >> 7;
				break;

			default:
				emu_logf(&chip->logger, DEVLOG_DEBUG, "unknown register write %02X = %02X\n", chip->current_register, data);
				break;
		}
	}
}